

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::ServiceOptions::_InternalParse(ServiceOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint64_t uVar2;
  UninterpretedOption *msg;
  UnknownFieldSet *unknown;
  uint uVar3;
  ulong tag_00;
  char *local_58;
  uint32_t tag;
  InternalMetadata *local_48;
  ServiceOptions *local_40;
  ExtensionSet *local_38;
  
  local_48 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_38 = &this->_extensions_;
  uVar3 = 0;
  local_58 = ptr;
  local_40 = this;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(ctx,&local_58);
      if (bVar1) goto LAB_0037fe23;
      local_58 = internal::ReadTag(local_58,&tag,0);
      tag_00 = (ulong)tag;
      if (tag >> 3 != 999) break;
      if ((char)tag == ':') {
        local_58 = local_58 + -2;
        do {
          local_58 = local_58 + 2;
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                          (&this->uninterpreted_option_);
          local_58 = internal::ParseContext::ParseMessage(ctx,(MessageLite *)msg,local_58);
          if (local_58 == (char *)0x0) goto LAB_0037fe0d;
        } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar1 = internal::ExpectTag<7994u>(local_58), bVar1));
      }
      else {
LAB_0037fdaa:
        if ((tag_00 == 0) || ((tag & 7) == 4)) {
          if (local_58 != (char *)0x0) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
            goto LAB_0037fe23;
          }
          goto LAB_0037fe0d;
        }
        if (tag < 8000) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields<google::protobuf::UnknownFieldSet>(local_48);
          local_58 = internal::UnknownFieldParse(tag_00,unknown,local_58,ctx);
        }
        else {
          local_58 = internal::ExtensionSet::ParseField
                               (local_38,tag_00,local_58,
                                (Message *)_ServiceOptions_default_instance_,local_48,ctx);
        }
        if (local_58 == (char *)0x0) goto LAB_0037fe0d;
      }
    }
    if ((tag >> 3 != 0x21) || ((char)tag != '\b')) goto LAB_0037fdaa;
    uVar2 = internal::ReadVarint64(&local_58);
    local_40->deprecated_ = uVar2 != 0;
    uVar3 = 1;
  } while (local_58 != (char *)0x0);
LAB_0037fe0d:
  local_58 = (char *)0x0;
LAB_0037fe23:
  (local_40->_has_bits_).has_bits_[0] = (local_40->_has_bits_).has_bits_[0] | uVar3;
  return local_58;
}

Assistant:

const char* ServiceOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    if ((8000u <= tag)) {
      ptr = _extensions_.ParseField(tag, ptr, internal_default_instance(), &_internal_metadata_, ctx);
      CHK_(ptr != nullptr);
      continue;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}